

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

bool amrex::ParmParse::QueryUnusedInputs(void)

{
  bool bVar1;
  ostream *poVar2;
  allocator local_29;
  string local_28;
  
  if (*(int *)(ParallelContext::frames + 0xc) == 0) {
    local_28._M_dataplus._M_p = (pointer)&local_28.field_2;
    local_28._M_string_length = 0;
    local_28.field_2._M_local_buf[0] = '\0';
    bVar1 = unused_table_entries_q((Table *)&(anonymous_namespace)::g_table_abi_cxx11_,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    if (bVar1) {
      finalize_verbose = system::verbose != 0;
      if ((bool)finalize_verbose) {
        poVar2 = OutStream();
        std::operator<<(poVar2,"Unused ParmParse Variables:\n");
      }
      std::__cxx11::string::string((string *)&local_28,"  [TOP]",&local_29);
      finalize_table(&local_28,(Table *)&(anonymous_namespace)::g_table_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_28);
      if (finalize_verbose != '\x01') {
        return true;
      }
      poVar2 = OutStream();
      std::endl<char,std::char_traits<char>>(poVar2);
      return true;
    }
  }
  return false;
}

Assistant:

ParmParse::Frame::Frame (ParmParse& pp, const std::string& pfix)
    :
    m_pp(pp), m_np(0)
{
    push(pfix);
    BL_ASSERT( m_np == 1 );
}